

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall
Catch::Detail::anon_unknown_0::
StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>::overflow
          (StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *this,int c
          )

{
  char *local_30;
  long local_28;
  char local_20 [16];
  
  (**(code **)(*(long *)this + 0x30))();
  if (c != -1) {
    if (*(undefined1 **)&this->field_0x20 == *(undefined1 **)&this->field_0x30) {
      local_30 = local_20;
      std::__cxx11::string::_M_construct((ulong)&local_30,'\x01');
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_30,local_28);
      if (local_30 != local_20) {
        operator_delete(local_30);
      }
    }
    else if (*(undefined1 **)&this->field_0x28 < *(undefined1 **)&this->field_0x30) {
      **(undefined1 **)&this->field_0x28 = (char)c;
      *(long *)&this->field_0x28 = *(long *)&this->field_0x28 + 1;
    }
    else {
      (**(code **)(*(long *)this + 0x68))(this,c & 0xff);
    }
  }
  return 0;
}

Assistant:

int overflow( int c ) override {
                sync();

                if( c != EOF ) {
                    if( pbase() == epptr() )
                        m_writer( std::string( 1, static_cast<char>( c ) ) );
                    else
                        sputc( static_cast<char>( c ) );
                }
                return 0;
            }